

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O2

CrispyValue std_str(CrispyValue *value,Vm *vm)

{
  ObjDict *dict;
  size_t length;
  char *pcVar1;
  CrispyValue CVar2;
  size_t sStack_40;
  char s [23];
  
  pcVar1 = s;
  switch(value->type) {
  case NIL:
    pcVar1 = "nil";
    sStack_40 = 3;
    break;
  case NUMBER:
    snprintf(s,0x17,"%.15g",(value->field_1).d_value);
    sStack_40 = strlen(s);
    break;
  case OBJECT:
    dict = (ObjDict *)(value->field_1).o_value;
    switch((dict->object).type) {
    case OBJ_STRING:
      goto switchD_00105fca_caseD_0;
    case OBJ_LAMBDA:
      pcVar1 = "<function>";
      sStack_40 = 10;
      break;
    case OBJ_NATIVE_FUNC:
      pcVar1 = "<native function>";
      sStack_40 = 0x11;
      break;
    case OBJ_DICT:
      pcVar1 = dict_to_string(dict);
      length = strlen(pcVar1);
      dict = (ObjDict *)new_string(vm,pcVar1,length);
      free(pcVar1);
      goto switchD_00105fca_caseD_0;
    case OBJ_LIST:
      pcVar1 = "<list>";
      sStack_40 = 6;
      break;
    default:
      goto switchD_00105f9e_default;
    }
    break;
  case BOOLEAN:
    if ((value->field_1).p_value == 0) {
      pcVar1 = "false";
      sStack_40 = 5;
    }
    else {
      pcVar1 = "true";
      sStack_40 = 4;
    }
    break;
  default:
switchD_00105f9e_default:
    dict = (ObjDict *)0x0;
    goto switchD_00105fca_caseD_0;
  }
  dict = (ObjDict *)new_string(vm,pcVar1,sStack_40);
switchD_00105fca_caseD_0:
  CVar2 = create_object(&dict->object);
  return CVar2;
}

Assistant:

CrispyValue std_str(CrispyValue *value, Vm *vm) {
    ObjString *string = NULL;

    switch (value->type) {
        case NUMBER: {
            char s[23];
            snprintf(s, 23, "%.15g", value->d_value);
            // crispy strings are not null terminated
            string = new_string(vm, s, strlen(s));
            break;
        }
        case OBJECT: {
            Object *object = value->o_value;

            switch (object->type) {
                case OBJ_STRING:
                    string = (ObjString *) object;
                    break;
                case OBJ_LAMBDA:
                    // TODO arity
                    string = new_string(vm, "<function>", 10);
                    break;
                case OBJ_NATIVE_FUNC:
                    // TODO arity
                    string = new_string(vm, "<native function>", 17);
                    break;
                case OBJ_DICT: {
                    char *dict_string = dict_to_string((ObjDict *) object);
                    string = new_string(vm, dict_string, strlen(dict_string));
                    free(dict_string);
                    break;
                }
                case OBJ_LIST:
                    string = new_string(vm, "<list>", 6);
                    break;
            }
            break;
        }
        case BOOLEAN: {
            string = value->p_value ? new_string(vm, "true", 4) : new_string(vm, "false", 5);
            break;
        }
        case NIL:
            string = new_string(vm, "nil", 3);
            break;
    }

    return create_object((Object *) string);
}